

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.periodic.c
# Opt level: O3

void pnga_periodic(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                  Integer op_code)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Integer type;
  Integer ndim;
  int counter [7];
  Integer hip [7];
  Integer dims [7];
  Integer range_num [7];
  Integer lop [7];
  Integer offset [7] [3];
  Integer range [7] [6];
  long local_558;
  void *local_550;
  long local_548;
  void *local_540;
  undefined8 local_538;
  Integer local_4f8 [8];
  Integer local_4b8 [8];
  ulong auStack_478 [2];
  undefined4 auStack_468 [2];
  long alStack_460 [2];
  undefined4 auStack_450 [2];
  long alStack_448 [2];
  Integer local_438 [2];
  int local_428 [12];
  int local_3f8 [112];
  long alStack_238 [22];
  long alStack_188 [43];
  
  local_550 = alpha;
  pnga_inquire(g_a,&local_558,&local_548,local_4b8);
  if (0 < local_548) {
    lVar8 = 0;
    do {
      lVar12 = lo[lVar8];
      local_4f8[lVar8] = lVar12;
      lVar11 = hi[lVar8];
      (&local_538)[lVar8] = lVar11;
      lVar11 = lVar11 - lVar12;
      if ((lVar11 < 0) ||
         (SBORROW8(lVar11,local_4b8[lVar8] * 2) == lVar11 + local_4b8[lVar8] * -2 < 0)) {
        pnga_error("g_a indices are invalid ",0);
        goto LAB_001239fc;
      }
      lVar8 = lVar8 + 1;
    } while (local_548 != lVar8);
    bVar17 = true;
    lVar8 = 0;
    do {
      lVar12 = local_4f8[lVar8];
      lVar11 = local_4b8[lVar8];
      if (lVar11 < lVar12) {
        lVar9 = lVar12 / lVar11;
        lVar12 = lVar12 % lVar11;
        local_4f8[lVar8] = lVar12;
        lVar14 = (&local_538)[lVar8] - lVar9 * lVar11;
        (&local_538)[lVar8] = lVar14;
        if (lVar9 != 0) {
          bVar17 = false;
        }
      }
      else {
        lVar14 = (&local_538)[lVar8];
      }
      if (lVar14 < 1) {
        lVar9 = lVar14 / lVar11 + 1;
        if (lVar9 != 0) {
          bVar17 = false;
        }
        lVar9 = lVar9 * lVar11;
        local_4f8[lVar8] = lVar12 + lVar9;
        (&local_538)[lVar8] = lVar9 + lVar14;
      }
      lVar8 = lVar8 + 1;
    } while (local_548 != lVar8);
    lVar8 = 0x40;
    lVar12 = 0x38;
    lVar9 = 0x28;
    lVar11 = 0x20;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)auStack_468 + lVar8) = 0;
      *(undefined1 (*) [16])((long)auStack_478 + lVar8) = (undefined1  [16])0x0;
      *(undefined8 *)((long)alStack_460 + lVar8) = 1;
      lVar4 = local_4b8[lVar14];
      *(long *)((long)alStack_460 + lVar8 + 8) = lVar4;
      *(undefined4 *)((long)auStack_450 + lVar8) = 0;
      *(long *)((long)alStack_448 + lVar8) = lVar4 + 1;
      *(undefined8 *)((long)alStack_448 + lVar8 + 8) = 0;
      *(undefined4 *)((long)local_438 + lVar8) = 0;
      lVar16 = local_4f8[lVar14];
      if (lVar16 < 1) {
        *(long *)((long)auStack_478 + lVar8) = lVar16;
        *(undefined4 *)((long)auStack_468 + lVar8) = 1;
        lVar16 = (&local_538)[lVar14];
        if (lVar4 < lVar16) {
          *(undefined4 *)((long)auStack_450 + lVar8) = 1;
        }
      }
      else {
        *(long *)((long)alStack_460 + lVar8) = lVar16;
        *(undefined4 *)((long)auStack_450 + lVar8) = 1;
        lVar16 = (&local_538)[lVar14];
      }
      lVar13 = lVar9;
      lVar7 = lVar11;
      if (lVar4 < lVar16) {
        lVar13 = lVar8;
        lVar7 = lVar12;
      }
      *(long *)((long)local_438 + lVar7) = lVar16;
      *(undefined4 *)((long)local_438 + lVar13) = 1;
      lVar14 = lVar14 + 1;
      lVar8 = lVar8 + 0x48;
      lVar12 = lVar12 + 0x48;
      lVar9 = lVar9 + 0x48;
      lVar11 = lVar11 + 0x48;
    } while (local_548 != lVar14);
    bVar5 = true;
    piVar10 = local_428;
    lVar8 = local_548;
    do {
      if ((*piVar10 != 0) || (piVar10[0xc] != 0)) {
        bVar5 = false;
      }
      piVar10 = piVar10 + 0x12;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    local_540 = buf;
    if ((!bVar5) || (!bVar17)) {
      piVar10 = local_3f8;
      lVar8 = 0;
      lVar12 = 0;
      do {
        auStack_478[lVar12] = 0;
        bVar17 = piVar10[-0xc] != 0;
        if (bVar17) {
          lVar14 = *(long *)(piVar10 + -0x10);
          lVar4 = *(long *)(piVar10 + -0xe);
          lVar11 = local_4b8[lVar12];
          auVar18._8_4_ = (int)lVar11;
          auVar18._0_8_ = lVar11;
          auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar9 = local_4f8[lVar12];
          *(long *)((long)alStack_188 + lVar8 * 2) = lVar11 + *(long *)(piVar10 + -0x10);
          *(long *)((long)alStack_188 + lVar8 * 2 + 8) = auVar18._8_8_ + lVar4;
          *(long *)((long)alStack_238 + lVar8) = lVar14 - lVar9;
          auStack_478[lVar12] = 1;
        }
        uVar15 = (ulong)bVar17;
        if (piVar10[-6] != 0) {
          lVar11 = *(long *)(piVar10 + -10);
          uVar6 = *(undefined8 *)(piVar10 + -8);
          puVar1 = (undefined8 *)((long)alStack_188 + lVar8 * 2 + (ulong)bVar17 * 0x10);
          *puVar1 = *(undefined8 *)(piVar10 + -10);
          puVar1[1] = uVar6;
          *(long *)((long)alStack_238 + lVar8 + uVar15 * 8) = lVar11 - local_4f8[lVar12];
          uVar15 = uVar15 + 1;
          auStack_478[lVar12] = uVar15;
        }
        if (*piVar10 != 0) {
          lVar14 = *(long *)(piVar10 + -4);
          lVar9 = *(long *)(piVar10 + -2);
          lVar11 = local_4b8[lVar12];
          auVar19._8_4_ = (int)lVar11;
          auVar19._0_8_ = lVar11;
          auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
          plVar2 = (long *)((long)alStack_188 + lVar8 * 2 + (ulong)(uint)((int)uVar15 << 4));
          *plVar2 = *(long *)(piVar10 + -4) - lVar11;
          plVar2[1] = lVar9 - auVar19._8_8_;
          *(long *)((long)alStack_238 + lVar8 + uVar15 * 8) = lVar14 - local_4f8[lVar12];
          auStack_478[lVar12] = uVar15 + 1;
        }
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x18;
        piVar10 = piVar10 + 0x12;
      } while (local_548 != lVar12);
LAB_001239fc:
      lVar8 = local_548;
      if (0 < local_548) {
        memset(&local_538,0,local_548 * 4);
      }
      do {
        do {
          if (lVar8 < 1) {
            lVar12 = 0;
          }
          else {
            lVar11 = 0;
            lVar12 = 0;
            do {
              iVar3 = *(int *)((long)&local_538 + lVar11 * 4);
              lVar14 = (long)iVar3;
              local_438[lVar11] = alStack_188[lVar11 * 6 + lVar14 * 2];
              local_4f8[lVar11] = alStack_188[lVar11 * 6 + (long)(iVar3 * 2 + 1)];
              if (lVar11 == 0) {
                lVar14 = alStack_238[lVar14];
              }
              else {
                lVar14 = alStack_238[lVar11 * 3 + lVar14];
                lVar9 = 0;
                do {
                  lVar14 = lVar14 * ld[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar11 != lVar9);
              }
              lVar12 = lVar12 + lVar14;
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar8);
          }
          if (op_code == 3) {
            pnga_acc(g_a,local_438,local_4f8,
                     (void *)(lVar12 * *(long *)(&DWORD_001d4378 + local_558 * 4) + (long)buf),ld,
                     local_550);
          }
          else if (op_code == 2) {
            pnga_put(g_a,local_438,local_4f8,
                     (void *)(lVar12 * *(long *)(&DWORD_001d4378 + local_558 * 4) + (long)buf),ld);
          }
          else if (op_code == 1) {
            pnga_get(g_a,local_438,local_4f8,
                     (void *)(lVar12 * *(long *)(&DWORD_001d4378 + local_558 * 4) + (long)buf),ld);
          }
          else {
            pnga_error("This operation is invalid ",0);
          }
          local_538._0_4_ = (int)local_538 + 1;
          lVar8 = local_548;
        } while (local_548 < 1);
        lVar12 = 0;
        do {
          if (auStack_478[lVar12] == (long)*(int *)((long)&local_538 + lVar12 * 4)) {
            *(undefined4 *)((long)&local_538 + lVar12 * 4) = 0;
            if (local_548 + -1 == lVar12) {
              return;
            }
            piVar10 = (int *)((long)&local_538 + lVar12 * 4 + 4);
            *piVar10 = *piVar10 + 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != local_548);
      } while( true );
    }
  }
  if (op_code == 3) {
    pnga_acc(g_a,lo,hi,buf,ld,local_550);
  }
  else if (op_code == 2) {
    pnga_put(g_a,lo,hi,buf,ld);
  }
  else if (op_code == 1) {
    pnga_get(g_a,lo,hi,buf,ld);
  }
  else {
    pnga_error("This operation is invalid ",0);
  }
  return;
}

Assistant:

void pnga_periodic(Integer g_a, Integer *lo, Integer *hi, void *buf,
                    Integer *ld, void *alpha, Integer op_code)
{
    int i, j, counter[MAXDIM], done;
    Integer type, ndim, dims[MAXDIM];
    Integer range[MAXDIM][RANGE_BOUND], range_num[MAXDIM];
    Integer offset[MAXDIM][RANGE_BOUND/2], my_offset, temp_offset;
    Integer lop[MAXDIM], hip[MAXDIM];
    int get_range;
    
    pnga_inquire(g_a, &type, &ndim, dims);

    get_range = ngai_peri_get_range_(ndim, dims, lo, hi, range, range_num,
                                     offset, op_code);
    
    if(!get_range) pnga_error("g_a indices are invalid ", 0L);

    /* If this is a regular patch, not periodic operation needed */
    if(get_range == IS_REGULAR_PATCH) {
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_ACC:    
              pnga_acc(g_a, lo, hi, buf, ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }
        return;
    }

    /* periodic operation continues */
    for(i=0; i<ndim; i++) counter[i] = 0;

    done = 0;
    do {
        my_offset = 0;
        
        for(i=0; i<ndim; i++) {
            lop[i] = range[i][counter[i]*2];
            hip[i] = range[i][counter[i]*2+1];

            /* calculate the offset */
            if(i == 0) my_offset += offset[i][counter[i]];
            else {
                temp_offset = offset[i][counter[i]];
                for(j=0; j<i; j++)
                    /* temp_offset *= dims[j]; */
                    temp_offset *= ld[j];
                my_offset += temp_offset;
            }
        }
        
        /* deal with this patch */
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_ACC:
              pnga_acc(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }      

        counter[0]++;
        for(i=0; i<ndim; i++) {
            if(counter[i] == range_num[i]) {
                counter[i] = 0;
                if(i == (ndim-1)) { done = 1; break; }
                else counter[i+1]++;
            }
        }
    } while(!done);
}